

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O1

int32 acmod_set_set_n_ci_hint(acmod_set_t *acmod_set,uint32 n_ci)

{
  ci_acmod_t *pcVar1;
  
  if (acmod_set->ci != (ci_acmod_t *)0x0) {
    __assert_fail("acmod_set->ci == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                  ,0xaa,"int32 acmod_set_set_n_ci_hint(acmod_set_t *, uint32)");
  }
  pcVar1 = (ci_acmod_t *)
           __ckd_calloc__((ulong)n_ci,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                          ,0xae);
  acmod_set->ci = pcVar1;
  acmod_set->max_n_ci = n_ci;
  if (acmod_set->next_id == 0) {
    return 0;
  }
  __assert_fail("acmod_set->next_id == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0xb2,"int32 acmod_set_set_n_ci_hint(acmod_set_t *, uint32)");
}

Assistant:

int32
acmod_set_set_n_ci_hint(acmod_set_t *acmod_set,
			uint32 n_ci)
{
    assert(acmod_set->ci == NULL);

    /* ckd_calloc aborts if no mem is avail */
    acmod_set->ci = ckd_calloc(n_ci,
			       sizeof(ci_acmod_t));

    acmod_set->max_n_ci = n_ci;

    assert(acmod_set->next_id == 0);

    return S3_SUCCESS;
}